

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::Curve::writeTo(Curve *this,BinaryWriter *binary)

{
  Shape::writeTo(&this->super_Shape,binary);
  BinaryWriter::writeRaw(binary,&this->width0,4);
  BinaryWriter::writeRaw(binary,&this->width1,4);
  BinaryWriter::writeRaw(binary,&this->basis,1);
  BinaryWriter::writeRaw(binary,&this->type,1);
  BinaryWriter::writeRaw(binary,&this->degree,1);
  BinaryWriter::write<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>,void>(binary,&this->P);
  BinaryWriter::writeRaw(binary,&this->transform,0x30);
  return 0x36;
}

Assistant:

int Curve::writeTo(BinaryWriter &binary) 
  {
    Shape::writeTo(binary);
    binary.write(width0);
    binary.write(width1);
    binary.write(basis);
    binary.write(type);
    binary.write(degree);
    binary.write(P);
    binary.write(transform);
    return TYPE_CURVE;
  }